

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

int mpt::type_properties<mpt::client_*>::id(bool obtain)

{
  if (id::traits == (named_traits *)0x0) {
    if (!obtain) {
      return -3;
    }
    id::traits = (named_traits *)mpt_client_type_traits();
    if (id::traits == (named_traits *)0x0) {
      return -3;
    }
  }
  return (int)id::traits->type;
}

Assistant:

int type_properties<client *>::id(bool obtain)
{
	static const named_traits *traits = 0;
	if (traits) {
		return traits->type;
	}
	if (!obtain) {
		return BadType;
	}
	if ((traits = client::pointer_traits())) {
		return traits->type;
	}
	return BadType;
}